

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

type jsoncons::jsonpointer::
     add<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,char[3],jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               char (*location_str) [3],
               basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value,
               bool create_if_missing,error_code *ec)

{
  bool bVar1;
  error_code *in_R8;
  basic_json_pointer<char> jsonptr;
  undefined7 in_stack_00000048;
  error_code *in_stack_00000130;
  bool in_stack_0000013f;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_00000140;
  basic_json_pointer<char> *in_stack_00000148;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_00000150;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  basic_json_pointer<char>::parse
            ((string_view_type *)CONCAT17(create_if_missing,in_stack_00000048),ec);
  bVar1 = std::error_code::operator_cast_to_bool(in_R8);
  if (!bVar1) {
    add<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_0000013f,
               in_stack_00000130);
  }
  basic_json_pointer<char>::~basic_json_pointer((basic_json_pointer<char> *)0x7241e6);
  return;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,void>::type
    add(Json& root, 
             const StringSource& location_str, 
             T&& value, 
             bool create_if_missing,
             std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        add(root, jsonptr, std::forward<T>(value), create_if_missing, ec);
    }